

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::SubGridMBIntersector1Pluecker<8,_true>_>::
     pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  byte bVar18;
  ulong *puVar19;
  ulong uVar20;
  long lVar21;
  byte bVar22;
  PointQueryType PVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  byte bVar25;
  ulong uVar26;
  bool bVar27;
  ulong uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  ulong local_2348;
  undefined4 local_2340 [2];
  ulong local_2338 [1127];
  
  local_2348 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2348 != 8) {
    local_2340[0] = 0;
    fVar1 = (query->p).field_0.field_0.x;
    auVar41._4_4_ = fVar1;
    auVar41._0_4_ = fVar1;
    auVar41._8_4_ = fVar1;
    auVar41._12_4_ = fVar1;
    auVar41._16_4_ = fVar1;
    auVar41._20_4_ = fVar1;
    auVar41._24_4_ = fVar1;
    auVar41._28_4_ = fVar1;
    fVar2 = (query->p).field_0.field_0.y;
    auVar42._4_4_ = fVar2;
    auVar42._0_4_ = fVar2;
    auVar42._8_4_ = fVar2;
    auVar42._12_4_ = fVar2;
    auVar42._16_4_ = fVar2;
    auVar42._20_4_ = fVar2;
    auVar42._24_4_ = fVar2;
    auVar42._28_4_ = fVar2;
    fVar3 = (query->p).field_0.field_0.z;
    auVar43._4_4_ = fVar3;
    auVar43._0_4_ = fVar3;
    auVar43._8_4_ = fVar3;
    auVar43._12_4_ = fVar3;
    auVar43._16_4_ = fVar3;
    auVar43._20_4_ = fVar3;
    auVar43._24_4_ = fVar3;
    auVar43._28_4_ = fVar3;
    fVar4 = (context->query_radius).field_0.m128[0];
    auVar50._4_4_ = fVar4;
    auVar50._0_4_ = fVar4;
    auVar50._8_4_ = fVar4;
    auVar50._12_4_ = fVar4;
    auVar50._16_4_ = fVar4;
    auVar50._20_4_ = fVar4;
    auVar50._24_4_ = fVar4;
    auVar50._28_4_ = fVar4;
    fVar5 = (context->query_radius).field_0.m128[1];
    auVar46._4_4_ = fVar5;
    auVar46._0_4_ = fVar5;
    auVar46._8_4_ = fVar5;
    auVar46._12_4_ = fVar5;
    auVar46._16_4_ = fVar5;
    auVar46._20_4_ = fVar5;
    auVar46._24_4_ = fVar5;
    auVar46._28_4_ = fVar5;
    fVar6 = (context->query_radius).field_0.m128[2];
    auVar48._4_4_ = fVar6;
    auVar48._0_4_ = fVar6;
    auVar48._8_4_ = fVar6;
    auVar48._12_4_ = fVar6;
    auVar48._16_4_ = fVar6;
    auVar48._20_4_ = fVar6;
    auVar48._24_4_ = fVar6;
    auVar48._28_4_ = fVar6;
    PVar23 = context->query_type;
    if (PVar23 == POINT_QUERY_TYPE_SPHERE) {
      auVar44 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar7 = (context->query_radius).field_0;
      auVar44 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    }
    puVar19 = local_2338;
    auVar50 = vsubps_avx(auVar41,auVar50);
    auVar45._0_4_ = fVar4 + fVar1;
    auVar45._4_4_ = fVar4 + fVar1;
    auVar45._8_4_ = fVar4 + fVar1;
    auVar45._12_4_ = fVar4 + fVar1;
    auVar45._16_4_ = fVar4 + fVar1;
    auVar45._20_4_ = fVar4 + fVar1;
    auVar45._24_4_ = fVar4 + fVar1;
    auVar45._28_4_ = fVar4 + fVar1;
    auVar46 = vsubps_avx(auVar42,auVar46);
    auVar47._0_4_ = fVar2 + fVar5;
    auVar47._4_4_ = fVar2 + fVar5;
    auVar47._8_4_ = fVar2 + fVar5;
    auVar47._12_4_ = fVar2 + fVar5;
    auVar47._16_4_ = fVar2 + fVar5;
    auVar47._20_4_ = fVar2 + fVar5;
    auVar47._24_4_ = fVar2 + fVar5;
    auVar47._28_4_ = fVar2 + fVar5;
    auVar48 = vsubps_avx(auVar43,auVar48);
    auVar49._0_4_ = fVar6 + fVar3;
    auVar49._4_4_ = fVar6 + fVar3;
    auVar49._8_4_ = fVar6 + fVar3;
    auVar49._12_4_ = fVar6 + fVar3;
    auVar49._16_4_ = fVar6 + fVar3;
    auVar49._20_4_ = fVar6 + fVar3;
    auVar49._24_4_ = fVar6 + fVar3;
    auVar49._28_4_ = fVar6 + fVar3;
    fVar4 = fVar4 * fVar4;
    auVar51._4_4_ = fVar4;
    auVar51._0_4_ = fVar4;
    auVar51._8_4_ = fVar4;
    auVar51._12_4_ = fVar4;
    auVar51._16_4_ = fVar4;
    auVar51._20_4_ = fVar4;
    auVar51._24_4_ = fVar4;
    auVar51._28_4_ = fVar4;
    auVar8 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar52._8_4_ = 0xfffffff8;
    auVar52._0_8_ = 0xfffffff8fffffff8;
    auVar52._12_4_ = 0xfffffff8;
    auVar52._16_4_ = 0xfffffff8;
    auVar52._20_4_ = 0xfffffff8;
    auVar52._24_4_ = 0xfffffff8;
    auVar52._28_4_ = 0xfffffff8;
    auVar9 = vpmovsxbd_avx2(ZEXT816(0x303020108));
    auVar10 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
    auVar29 = vpmovsxbd_avx512vl(ZEXT816(0x605040302010008));
    auVar30 = vpbroadcastd_avx512vl(ZEXT416(1));
    do {
      bVar27 = (ulong *)0xf < puVar19;
      puVar19 = puVar19 + -2;
      vucomiss_avx512f(auVar44);
      if (bVar27 || puVar19 == (ulong *)0x0) {
        uVar20 = *puVar19;
        do {
          if (PVar23 == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar20 & 8) != 0) {
              PVar23 = POINT_QUERY_TYPE_SPHERE;
              break;
            }
            uVar24 = uVar20 & 0xfffffffffffffff0;
            auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)query->time));
            auVar32 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar24 + 0x100),auVar31,
                                 *(undefined1 (*) [32])(uVar24 + 0x40));
            auVar33 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar24 + 0x140),auVar31,
                                 *(undefined1 (*) [32])(uVar24 + 0x80));
            auVar34 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar24 + 0x180),auVar31,
                                 *(undefined1 (*) [32])(uVar24 + 0xc0));
            auVar35 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar24 + 0x120),auVar31,
                                 *(undefined1 (*) [32])(uVar24 + 0x60));
            auVar36 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar24 + 0x160),auVar31,
                                 *(undefined1 (*) [32])(uVar24 + 0xa0));
            auVar37 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar24 + 0x1a0),auVar31,
                                 *(undefined1 (*) [32])(uVar24 + 0xe0));
            auVar38 = vmaxps_avx512vl(auVar41,auVar32);
            auVar38 = vminps_avx512vl(auVar38,auVar35);
            auVar38 = vsubps_avx512vl(auVar38,auVar41);
            auVar33 = vmaxps_avx512vl(auVar42,auVar33);
            auVar33 = vminps_avx512vl(auVar33,auVar36);
            auVar33 = vsubps_avx512vl(auVar33,auVar42);
            auVar34 = vmaxps_avx512vl(auVar43,auVar34);
            auVar34 = vminps_avx512vl(auVar34,auVar37);
            auVar34 = vsubps_avx512vl(auVar34,auVar43);
            auVar36 = vmulps_avx512vl(auVar38,auVar38);
            auVar33 = vmulps_avx512vl(auVar33,auVar33);
            auVar33 = vaddps_avx512vl(auVar36,auVar33);
            auVar34 = vmulps_avx512vl(auVar34,auVar34);
            auVar38 = vaddps_avx512vl(auVar33,auVar34);
            uVar28 = vcmpps_avx512vl(auVar38,auVar51,2);
            uVar26 = vcmpps_avx512vl(auVar32,auVar35,2);
            uVar28 = uVar28 & uVar26;
            if (((uint)uVar20 & 7) == 6) {
              uVar17 = vcmpps_avx512vl(auVar31,*(undefined1 (*) [32])(uVar24 + 0x1c0),0xd);
              uVar16 = vcmpps_avx512vl(auVar31,*(undefined1 (*) [32])(uVar24 + 0x1e0),1);
              uVar28 = (ulong)(byte)((byte)uVar17 & (byte)uVar16 & (byte)uVar28);
            }
          }
          else {
            if ((uVar20 & 8) != 0) break;
            uVar26 = uVar20 & 0xfffffffffffffff0;
            auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)query->time));
            auVar32 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar26 + 0x100),auVar31,
                                 *(undefined1 (*) [32])(uVar26 + 0x40));
            auVar33 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar26 + 0x140),auVar31,
                                 *(undefined1 (*) [32])(uVar26 + 0x80));
            auVar34 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar26 + 0x180),auVar31,
                                 *(undefined1 (*) [32])(uVar26 + 0xc0));
            auVar35 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar26 + 0x120),auVar31,
                                 *(undefined1 (*) [32])(uVar26 + 0x60));
            auVar36 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar26 + 0x160),auVar31,
                                 *(undefined1 (*) [32])(uVar26 + 0xa0));
            auVar37 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar26 + 0x1a0),auVar31,
                                 *(undefined1 (*) [32])(uVar26 + 0xe0));
            auVar38 = vmaxps_avx512vl(auVar41,auVar32);
            auVar38 = vminps_avx512vl(auVar38,auVar35);
            auVar38 = vsubps_avx512vl(auVar38,auVar41);
            auVar40 = vmaxps_avx512vl(auVar42,auVar33);
            auVar40 = vminps_avx512vl(auVar40,auVar36);
            auVar40 = vsubps_avx512vl(auVar40,auVar42);
            auVar39 = vmaxps_avx512vl(auVar43,auVar34);
            auVar39 = vminps_avx512vl(auVar39,auVar37);
            auVar39 = vsubps_avx512vl(auVar39,auVar43);
            auVar38 = vmulps_avx512vl(auVar38,auVar38);
            auVar40 = vmulps_avx512vl(auVar40,auVar40);
            auVar38 = vaddps_avx512vl(auVar38,auVar40);
            auVar40 = vmulps_avx512vl(auVar39,auVar39);
            auVar38 = vaddps_avx512vl(auVar38,auVar40);
            uVar17 = vcmpps_avx512vl(auVar32,auVar35,2);
            uVar16 = vcmpps_avx512vl(auVar35,auVar50,1);
            uVar11 = vcmpps_avx512vl(auVar32,auVar45,6);
            uVar12 = vcmpps_avx512vl(auVar36,auVar46,1);
            uVar13 = vcmpps_avx512vl(auVar33,auVar47,6);
            uVar14 = vcmpps_avx512vl(auVar37,auVar48,1);
            uVar15 = vcmpps_avx512vl(auVar34,auVar49,6);
            bVar25 = ~((byte)uVar13 | (byte)uVar11 | (byte)uVar15 | (byte)uVar16 |
                      (byte)uVar12 | (byte)uVar14) & (byte)uVar17;
            uVar28 = (ulong)bVar25;
            if (((uint)uVar20 & 7) == 6) {
              uVar17 = vcmpps_avx512vl(auVar31,*(undefined1 (*) [32])(uVar26 + 0x1e0),1);
              uVar16 = vcmpps_avx512vl(auVar31,*(undefined1 (*) [32])(uVar26 + 0x1c0),0xd);
              uVar28 = (ulong)(bVar25 & (byte)uVar17 & (byte)uVar16);
            }
          }
          bVar25 = (byte)uVar28;
          if (bVar25 == 0) break;
          auVar31 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(uVar20 & 0xfffffffffffffff0));
          auVar32 = vmovdqu64_avx512vl(((undefined1 (*) [32])(uVar20 & 0xfffffffffffffff0))[1]);
          auVar33 = vmovdqa64_avx512vl(auVar8);
          auVar33 = vpternlogd_avx512vl(auVar33,auVar38,auVar52,0xf8);
          auVar34 = vpcompressd_avx512vl(auVar33);
          auVar35._0_4_ =
               (uint)(bVar25 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar25 & 1) * auVar33._0_4_;
          bVar27 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar35._4_4_ = (uint)bVar27 * auVar34._4_4_ | (uint)!bVar27 * auVar33._4_4_;
          bVar27 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar35._8_4_ = (uint)bVar27 * auVar34._8_4_ | (uint)!bVar27 * auVar33._8_4_;
          bVar27 = (bool)((byte)(uVar28 >> 3) & 1);
          auVar35._12_4_ = (uint)bVar27 * auVar34._12_4_ | (uint)!bVar27 * auVar33._12_4_;
          bVar27 = (bool)((byte)(uVar28 >> 4) & 1);
          auVar35._16_4_ = (uint)bVar27 * auVar34._16_4_ | (uint)!bVar27 * auVar33._16_4_;
          bVar27 = (bool)((byte)(uVar28 >> 5) & 1);
          auVar35._20_4_ = (uint)bVar27 * auVar34._20_4_ | (uint)!bVar27 * auVar33._20_4_;
          bVar27 = (bool)((byte)(uVar28 >> 6) & 1);
          auVar35._24_4_ = (uint)bVar27 * auVar34._24_4_ | (uint)!bVar27 * auVar33._24_4_;
          bVar27 = SUB81(uVar28 >> 7,0);
          auVar35._28_4_ = (uint)bVar27 * auVar34._28_4_ | (uint)!bVar27 * auVar33._28_4_;
          auVar33 = vmovdqa64_avx512vl(auVar31);
          auVar33 = vpermt2q_avx512vl(auVar33,auVar35,auVar32);
          uVar20 = auVar33._0_8_;
          bVar25 = bVar25 - 1 & bVar25;
          if (bVar25 != 0) {
            auVar33 = vpshufd_avx512vl(auVar35,0x55);
            auVar34 = vmovdqa64_avx512vl(auVar31);
            vpermt2q_avx512vl(auVar34,auVar33,auVar32);
            auVar34 = vpminsd_avx512vl(auVar35,auVar33);
            auVar33 = vpmaxsd_avx512vl(auVar35,auVar33);
            bVar25 = bVar25 - 1 & bVar25;
            if (bVar25 == 0) {
              auVar34 = vpermi2q_avx512vl(auVar34,auVar31,auVar32);
              uVar20 = auVar34._0_8_;
              auVar31 = vpermt2q_avx512vl(auVar31,auVar33,auVar32);
              *puVar19 = auVar31._0_8_;
              auVar31 = vpermd_avx512vl(auVar33,auVar38);
              *(int *)(puVar19 + 1) = auVar31._0_4_;
              puVar19 = puVar19 + 2;
            }
            else {
              auVar36 = vpshufd_avx512vl(auVar35,0xaa);
              auVar37 = vmovdqa64_avx512vl(auVar31);
              vpermt2q_avx512vl(auVar37,auVar36,auVar32);
              auVar37 = vpminsd_avx512vl(auVar34,auVar36);
              auVar34 = vpmaxsd_avx512vl(auVar34,auVar36);
              auVar36 = vpminsd_avx512vl(auVar33,auVar34);
              auVar33 = vpmaxsd_avx512vl(auVar33,auVar34);
              bVar25 = bVar25 - 1 & bVar25;
              if (bVar25 == 0) {
                auVar34 = vpermi2q_avx512vl(auVar37,auVar31,auVar32);
                uVar20 = auVar34._0_8_;
                auVar34 = vmovdqa64_avx512vl(auVar31);
                auVar34 = vpermt2q_avx512vl(auVar34,auVar33,auVar32);
                *puVar19 = auVar34._0_8_;
                auVar33 = vpermd_avx512vl(auVar33,auVar38);
                *(int *)(puVar19 + 1) = auVar33._0_4_;
                auVar31 = vpermt2q_avx512vl(auVar31,auVar36,auVar32);
                puVar19[2] = auVar31._0_8_;
                auVar31 = vpermd_avx512vl(auVar36,auVar38);
                *(int *)(puVar19 + 3) = auVar31._0_4_;
                puVar19 = puVar19 + 4;
              }
              else {
                auVar34 = vpshufd_avx512vl(auVar35,0xff);
                auVar40 = vmovdqa64_avx512vl(auVar31);
                vpermt2q_avx512vl(auVar40,auVar34,auVar32);
                auVar40 = vpminsd_avx512vl(auVar37,auVar34);
                auVar34 = vpmaxsd_avx512vl(auVar37,auVar34);
                auVar37 = vpminsd_avx512vl(auVar36,auVar34);
                auVar34 = vpmaxsd_avx512vl(auVar36,auVar34);
                auVar36 = vpminsd_avx512vl(auVar33,auVar34);
                auVar33 = vpmaxsd_avx512vl(auVar33,auVar34);
                bVar25 = bVar25 - 1 & bVar25;
                if (bVar25 == 0) {
                  auVar34 = vpermi2q_avx512vl(auVar40,auVar31,auVar32);
                  uVar20 = auVar34._0_8_;
                  auVar34 = vmovdqa64_avx512vl(auVar31);
                  auVar34 = vpermt2q_avx512vl(auVar34,auVar33,auVar32);
                  *puVar19 = auVar34._0_8_;
                  auVar33 = vpermd_avx512vl(auVar33,auVar38);
                  *(int *)(puVar19 + 1) = auVar33._0_4_;
                  auVar33 = vmovdqa64_avx512vl(auVar31);
                  auVar33 = vpermt2q_avx512vl(auVar33,auVar36,auVar32);
                  puVar19[2] = auVar33._0_8_;
                  auVar33 = vpermd_avx512vl(auVar36,auVar38);
                  *(int *)(puVar19 + 3) = auVar33._0_4_;
                  auVar31 = vpermt2q_avx512vl(auVar31,auVar37,auVar32);
                  puVar19[4] = auVar31._0_8_;
                  auVar31 = vpermd_avx512vl(auVar37,auVar38);
                  *(int *)(puVar19 + 5) = auVar31._0_4_;
                  puVar19 = puVar19 + 6;
                }
                else {
                  auVar35 = valignd_avx512vl(auVar35,auVar35,3);
                  auVar34 = vmovdqa64_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                  CONCAT48(0x80000000,
                                                                           0x8000000080000000))));
                  auVar34 = vpermt2d_avx512vl(auVar34,auVar9,auVar40);
                  auVar34 = vpermt2d_avx512vl(auVar34,auVar10,auVar37);
                  auVar34 = vpermt2d_avx512vl(auVar34,auVar10,auVar36);
                  auVar33 = vpermt2d_avx512vl(auVar34,auVar29,auVar33);
                  auVar53 = ZEXT3264(auVar33);
                  bVar22 = bVar25;
                  do {
                    auVar33 = vmovdqa64_avx512vl(auVar53._0_32_);
                    auVar34 = vpermd_avx512vl(auVar30,auVar35);
                    auVar35 = valignd_avx512vl(auVar35,auVar35,1);
                    auVar36 = vmovdqa64_avx512vl(auVar31);
                    vpermt2q_avx512vl(auVar36,auVar35,auVar32);
                    bVar22 = bVar22 - 1 & bVar22;
                    uVar17 = vpcmpd_avx512vl(auVar34,auVar33,5);
                    auVar34 = vpmaxsd_avx512vl(auVar34,auVar33);
                    bVar18 = (byte)uVar17 << 1;
                    auVar33 = valignd_avx512vl(auVar33,auVar33,7);
                    bVar27 = (bool)((byte)uVar17 & 1);
                    auVar36._4_4_ = (uint)bVar27 * auVar33._4_4_ | (uint)!bVar27 * auVar34._4_4_;
                    auVar36._0_4_ = auVar34._0_4_;
                    bVar27 = (bool)(bVar18 >> 2 & 1);
                    auVar36._8_4_ = (uint)bVar27 * auVar33._8_4_ | (uint)!bVar27 * auVar34._8_4_;
                    bVar27 = (bool)(bVar18 >> 3 & 1);
                    auVar36._12_4_ = (uint)bVar27 * auVar33._12_4_ | (uint)!bVar27 * auVar34._12_4_;
                    bVar27 = (bool)(bVar18 >> 4 & 1);
                    auVar36._16_4_ = (uint)bVar27 * auVar33._16_4_ | (uint)!bVar27 * auVar34._16_4_;
                    bVar27 = (bool)(bVar18 >> 5 & 1);
                    auVar36._20_4_ = (uint)bVar27 * auVar33._20_4_ | (uint)!bVar27 * auVar34._20_4_;
                    bVar27 = (bool)(bVar18 >> 6 & 1);
                    auVar36._24_4_ = (uint)bVar27 * auVar33._24_4_ | (uint)!bVar27 * auVar34._24_4_;
                    auVar36._28_4_ =
                         (uint)(bVar18 >> 7) * auVar33._28_4_ |
                         (uint)!(bool)(bVar18 >> 7) * auVar34._28_4_;
                    auVar53 = ZEXT3264(auVar36);
                  } while (bVar22 != 0);
                  lVar21 = (ulong)(uint)POPCOUNT((uint)bVar25) + 3;
                  auVar33 = vmovdqa64_avx512vl(auVar36);
                  do {
                    auVar33 = vpermi2q_avx512vl(auVar33,auVar31,auVar32);
                    *puVar19 = auVar33._0_8_;
                    auVar34 = auVar53._0_32_;
                    auVar33 = vpermd_avx512vl(auVar34,auVar38);
                    *(int *)(puVar19 + 1) = auVar33._0_4_;
                    auVar33 = valignd_avx512vl(auVar34,auVar34,1);
                    puVar19 = puVar19 + 2;
                    auVar34 = vmovdqa64_avx512vl(auVar33);
                    auVar53 = ZEXT3264(auVar34);
                    lVar21 = lVar21 + -1;
                  } while (lVar21 != 0);
                  auVar31 = vpermt2q_avx512vl(auVar31,auVar33,auVar32);
                  uVar20 = auVar31._0_8_;
                }
              }
            }
          }
          PVar23 = context->query_type;
        } while( true );
      }
    } while (puVar19 != &local_2348);
  }
  return false;
}

Assistant:

bool BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::pointQuery(
      const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
    {
      return PointQueryDispatch<N, types, robust, PrimitiveIntersector1>::pointQuery(This, query, context);
    }